

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

int cvLsFree(CVodeMem cv_mem)

{
  long lVar1;
  long in_RDI;
  CVLsMem cvls_mem;
  
  if ((in_RDI != 0) && (*(long *)(in_RDI + 0x7e0) != 0)) {
    lVar1 = *(long *)(in_RDI + 0x7e0);
    if (*(long *)(lVar1 + 0x60) != 0) {
      N_VDestroy(*(undefined8 *)(lVar1 + 0x60));
      *(undefined8 *)(lVar1 + 0x60) = 0;
    }
    if (*(long *)(lVar1 + 0x68) != 0) {
      N_VDestroy(*(undefined8 *)(lVar1 + 0x68));
      *(undefined8 *)(lVar1 + 0x68) = 0;
    }
    if (*(long *)(lVar1 + 0x58) != 0) {
      SUNMatDestroy(*(undefined8 *)(lVar1 + 0x58));
      *(undefined8 *)(lVar1 + 0x58) = 0;
    }
    *(undefined8 *)(lVar1 + 0x70) = 0;
    *(undefined8 *)(lVar1 + 0x78) = 0;
    *(undefined8 *)(lVar1 + 0x50) = 0;
    if (*(long *)(lVar1 + 0xe8) != 0) {
      (**(code **)(lVar1 + 0xe8))(in_RDI);
    }
    free(*(void **)(in_RDI + 0x7e0));
  }
  return 0;
}

Assistant:

int cvLsFree(CVodeMem cv_mem)
{
  CVLsMem cvls_mem;

  /* Return immediately if CVodeMem or CVLsMem  are NULL */
  if (cv_mem == NULL) { return (CVLS_SUCCESS); }
  if (cv_mem->cv_lmem == NULL) { return (CVLS_SUCCESS); }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* Free N_Vector memory */
  if (cvls_mem->ytemp)
  {
    N_VDestroy(cvls_mem->ytemp);
    cvls_mem->ytemp = NULL;
  }
  if (cvls_mem->x)
  {
    N_VDestroy(cvls_mem->x);
    cvls_mem->x = NULL;
  }

  /* Free savedJ memory */
  if (cvls_mem->savedJ)
  {
    SUNMatDestroy(cvls_mem->savedJ);
    cvls_mem->savedJ = NULL;
  }

  /* Nullify other N_Vector pointers */
  cvls_mem->ycur = NULL;
  cvls_mem->fcur = NULL;

  /* Nullify other SUNMatrix pointer */
  cvls_mem->A = NULL;

  /* Free preconditioner memory (if applicable) */
  if (cvls_mem->pfree) { cvls_mem->pfree(cv_mem); }

  /* free CVLs interface structure */
  free(cv_mem->cv_lmem);

  return (CVLS_SUCCESS);
}